

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O2

void __thiscall Ptex::v2_2::PtexReaderCache::getStats(PtexReaderCache *this,Stats *stats)

{
  ulong uVar1;
  uint64_t uVar2;
  
  stats->memUsed = this->_memUsed;
  stats->peakMemUsed = this->_peakMemUsed;
  stats->filesOpen = this->_filesOpen;
  stats->peakFilesOpen = this->_peakFilesOpen;
  uVar1 = (ulong)(this->_files)._size;
  stats->filesAccessed = uVar1;
  uVar2 = 0;
  if (uVar1 <= this->_fileOpens) {
    uVar2 = this->_fileOpens - uVar1;
  }
  stats->fileReopens = uVar2;
  stats->blockReads = this->_blockReads;
  return;
}

Assistant:

void PtexReaderCache::getStats(Stats& stats)
{
    stats.memUsed = _memUsed;
    stats.peakMemUsed = _peakMemUsed;
    stats.filesOpen = _filesOpen;
    stats.peakFilesOpen = _peakFilesOpen;
    stats.filesAccessed = _files.size();
    stats.fileReopens = _fileOpens < stats.filesAccessed ? 0 : _fileOpens - stats.filesAccessed;
    stats.blockReads = _blockReads;
}